

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# locid.cpp
# Opt level: O3

int32_t __thiscall icu_63::KeywordEnumeration::count(KeywordEnumeration *this,UErrorCode *param_1)

{
  size_t sVar1;
  int32_t iVar2;
  char *__s;
  
  __s = this->keywords;
  if (*__s == '\0') {
    iVar2 = 0;
  }
  else {
    iVar2 = 0;
    do {
      iVar2 = iVar2 + 1;
      sVar1 = strlen(__s);
      __s = __s + sVar1 + 1;
    } while (*__s != '\0');
  }
  return iVar2;
}

Assistant:

virtual int32_t count(UErrorCode &/*status*/) const {
        char *kw = keywords;
        int32_t result = 0;
        while(*kw) {
            result++;
            kw += uprv_strlen(kw)+1;
        }
        return result;
    }